

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::MessageGenerator
          (MessageGenerator *this,string *file_description_name,Descriptor *descriptor,
          GenerationOptions *generation_options)

{
  undefined4 uVar1;
  GenerationOptions *descriptor_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  FileDescriptor *file;
  MessageOptions *pMVar5;
  LogMessage *pLVar6;
  reference this_00;
  pointer this_01;
  size_type sVar7;
  Descriptor *descriptor_01;
  unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
  *generator;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  *__range3;
  int sizeof_has_storage;
  int num_has_bits;
  value_type local_70;
  undefined1 local_68 [8];
  int i;
  Voidify local_4a;
  byte local_49;
  LogMessage local_48;
  Voidify local_35 [13];
  undefined1 local_28 [8];
  GenerationOptions *generation_options_local;
  Descriptor *descriptor_local;
  string *file_description_name_local;
  MessageGenerator *this_local;
  
  local_28 = (undefined1  [8])generation_options;
  generation_options_local = (GenerationOptions *)descriptor;
  descriptor_local = (Descriptor *)file_description_name;
  file_description_name_local = &this->file_description_name_;
  std::__cxx11::string::string((string *)this,(string *)file_description_name);
  this->descriptor_ = (Descriptor *)generation_options_local;
  this->generation_options_ = (GenerationOptions *)local_28;
  FieldGeneratorMap::FieldGeneratorMap
            (&this->field_generators_,(Descriptor *)generation_options_local,
             (GenerationOptions *)local_28);
  ClassName_abi_cxx11_(&this->class_name_,(objectivec *)this->descriptor_,descriptor_01);
  descriptor_00 = generation_options_local;
  file = Descriptor::file((Descriptor *)generation_options_local);
  GetOptionalDeprecatedAttribute<google::protobuf::Descriptor>
            (&this->deprecated_attribute_,(Descriptor *)descriptor_00,file);
  std::
  vector<const_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ::vector(&this->extension_generators_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  ::vector(&this->oneof_generators_);
  local_49 = 0;
  pMVar5 = Descriptor::options((Descriptor *)generation_options_local);
  bVar2 = MessageOptions::map_entry(pMVar5);
  if (bVar2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/message.cc"
               ,0xce,"!descriptor->options().map_entry()");
    local_49 = 1;
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar6,(char (*) [43])"error: MessageGenerator create of a map<>!");
    absl::lts_20250127::log_internal::Voidify::operator&&(local_35,pLVar6);
  }
  if ((local_49 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  local_68[7] = 0;
  pMVar5 = Descriptor::options((Descriptor *)generation_options_local);
  bVar3 = MessageOptions::message_set_wire_format(pMVar5);
  bVar2 = true;
  if (bVar3) {
    iVar4 = Descriptor::field_count((Descriptor *)generation_options_local);
    bVar2 = iVar4 == 0;
  }
  if (!bVar2) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&i,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/message.cc"
               ,0xd1,
               "!descriptor->options().message_set_wire_format() || descriptor->field_count() == 0")
    ;
    local_68[7] = 1;
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::InternalStream((LogMessage *)&i);
    pLVar6 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar6,(char (*) [74])
                               "error: MessageGenerator message_set_wire_format should never have fields!"
                       );
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_4a,pLVar6);
  }
  if ((local_68[7] & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&i);
  }
  for (local_68._0_4_ = 0; uVar1 = local_68._0_4_,
      iVar4 = Descriptor::real_oneof_decl_count(this->descriptor_), (int)uVar1 < iVar4;
      local_68._0_4_ = local_68._0_4_ + 1) {
    _sizeof_has_storage = Descriptor::real_oneof_decl(this->descriptor_,local_68._0_4_);
    std::
    make_unique<google::protobuf::compiler::objectivec::OneofGenerator,google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::objectivec::GenerationOptions_const&>
              ((OneofDescriptor **)&local_70,(GenerationOptions *)&sizeof_has_storage);
    std::
    vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
    ::push_back(&this->oneof_generators_,&local_70);
    std::
    unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
    ::~unique_ptr(&local_70);
  }
  iVar4 = FieldGeneratorMap::CalculateHasBits(&this->field_generators_);
  __range3._0_4_ = (iVar4 + 0x1f) / 0x20;
  if ((int)__range3 == 0) {
    __range3._0_4_ = 1;
  }
  __end3 = std::
           vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
           ::begin(&this->oneof_generators_);
  generator = (unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
               *)std::
                 vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                 ::end(&this->oneof_generators_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
                                     *)&generator), bVar2) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
              ::operator*(&__end3);
    this_01 = std::
              unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
              ::operator->(this_00);
    OneofGenerator::SetOneofIndexBase(this_01,(int)__range3);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_*,_std::vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>_>
    ::operator++(&__end3);
  }
  FieldGeneratorMap::SetOneofIndexBase(&this->field_generators_,(int)__range3);
  sVar7 = std::
          vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
          ::size(&this->oneof_generators_);
  this->sizeof_has_storage_ = (int)__range3 + (int)sVar7;
  return;
}

Assistant:

MessageGenerator::MessageGenerator(const std::string& file_description_name,
                                   const Descriptor* descriptor,
                                   const GenerationOptions& generation_options)
    : file_description_name_(file_description_name),
      descriptor_(descriptor),
      generation_options_(generation_options),
      field_generators_(descriptor, generation_options),
      class_name_(ClassName(descriptor_)),
      deprecated_attribute_(
          GetOptionalDeprecatedAttribute(descriptor, descriptor->file())) {
  ABSL_CHECK(!descriptor->options().map_entry())
      << "error: MessageGenerator create of a map<>!";
  ABSL_CHECK(!descriptor->options().message_set_wire_format() ||
             descriptor->field_count() == 0)
      << "error: MessageGenerator message_set_wire_format should never have "
         "fields!";
  for (int i = 0; i < descriptor_->real_oneof_decl_count(); i++) {
    oneof_generators_.push_back(std::make_unique<OneofGenerator>(
        descriptor_->real_oneof_decl(i), generation_options));
  }

  // Assign has bits:
  // 1. FieldGeneratorMap::CalculateHasBits() loops through the fields seeing
  //    who needs has bits and assigning them.
  // 2. FieldGenerator::SetOneofIndexBase() overrides has_bit with a negative
  //    index that groups all the elements in the oneof.
  int num_has_bits = field_generators_.CalculateHasBits();
  int sizeof_has_storage = (num_has_bits + 31) / 32;
  if (sizeof_has_storage == 0) {
    // In the case where no field needs has bits, don't let the _has_storage_
    // end up as zero length (zero length arrays are sort of a grey area
    // since it has to be at the start of the struct). This also ensures a
    // field with only oneofs keeps the required negative indices they need.
    sizeof_has_storage = 1;
  }
  // Tell all the fields the oneof base.
  for (const auto& generator : oneof_generators_) {
    generator->SetOneofIndexBase(sizeof_has_storage);
  }
  field_generators_.SetOneofIndexBase(sizeof_has_storage);
  // sizeof_has_storage needs enough bits for the single fields that aren't in
  // any oneof, and then one int32 for each oneof (to store the field number).
  sizeof_has_storage += oneof_generators_.size();

  sizeof_has_storage_ = sizeof_has_storage;
}